

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

UBool icu_63::DateFormatSymbols::isNumericPatternChar(UChar c,int32_t count)

{
  UBool UVar1;
  UDateFormatField f;
  
  f = getPatternCharIndex(c);
  UVar1 = isNumericField(f,count);
  return UVar1;
}

Assistant:

UBool U_EXPORT2
DateFormatSymbols::isNumericPatternChar(UChar c, int32_t count) {
    return isNumericField(getPatternCharIndex(c), count);
}